

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  int length;
  char *zP4;
  double value;
  
  if (z != (char *)0x0) {
    length = sqlite3Strlen30(z);
    sqlite3AtoF(z,&value,length,'\x01');
    if (negateFlag != 0) {
      value = -value;
    }
    zP4 = dup8bytes(v,(char *)&value);
    sqlite3VdbeAddOp4(v,0x82,0,iMem,0,zP4,-0xc);
  }
  return;
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    char *zV;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    zV = dup8bytes(v, (char*)&value);
    sqlite3VdbeAddOp4(v, OP_Real, 0, iMem, 0, zV, P4_REAL);
  }
}